

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void TestCompat(Span<const_unsigned_char> der)

{
  bool bVar1;
  int iVar2;
  uchar *buf;
  size_t sVar3;
  BIO *pBVar4;
  char *pcVar5;
  PKCS12 *pPVar6;
  pointer p12_00;
  char *in_R9;
  AssertHelper local_278;
  Message local_270;
  size_t local_268;
  uint local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  AssertHelper local_228;
  Message local_220;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1e8;
  Message local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__5;
  UniquePtr<struct_stack_st_X509> delete_ca_certs;
  UniquePtr<X509> delete_cert;
  UniquePtr<EVP_PKEY> delete_key;
  AssertHelper local_190;
  Message local_188;
  int local_17c;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__4;
  stack_st_X509 *ca_certs;
  X509 *cert;
  EVP_PKEY *key;
  AssertHelper local_130;
  Message local_128;
  int local_11c;
  undefined1 local_118 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a0;
  Message local_98;
  undefined1 local_90 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<PKCS12> p12;
  string local_70;
  AssertHelper local_50;
  Message local_48 [3];
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BIO> bio;
  Span<const_unsigned_char> der_local;
  
  bio._M_t.super___uniq_ptr_impl<bio_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_bio_st_*,_bssl::internal::Deleter>.super__Head_base<0UL,_bio_st_*,_false>.
  _M_head_impl = (__uniq_ptr_data<bio_st,_bssl::internal::Deleter,_true,_true>)der.data_;
  buf = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&bio);
  sVar3 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&bio);
  pBVar4 = BIO_new_mem_buf(buf,(int)sVar3);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pBVar4);
  testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_30,
             (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_70,(internal *)local_30,(AssertionResult *)0x8a2d4f,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x42,pcVar5);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (bVar1) {
    pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                              ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    pPVar6 = d2i_PKCS12_bio(pBVar4,(PKCS12 **)0x0);
    std::unique_ptr<pkcs12_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
              ((unique_ptr<pkcs12_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,
               (pointer)pPVar6);
    testing::AssertionResult::AssertionResult<std::unique_ptr<pkcs12_st,bssl::internal::Deleter>>
              ((AssertionResult *)local_90,
               (unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_90,(AssertionResult *)0x868ac5,
                 "false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x45,pcVar5);
      testing::internal::AssertHelper::operator=(&local_a0,&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_a0);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_98);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    if (bVar1) {
      pPVar6 = (PKCS12 *)
               std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::get
                         ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
      iVar2 = PKCS12_verify_mac(pPVar6,"badpass",7);
      local_d1 = iVar2 == 0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_d0,&local_d1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_d0,
                   (AssertionResult *)"PKCS12_verify_mac(p12.get(), \"badpass\", 7)","true","false",
                   in_R9);
        pcVar5 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                   ,0x47,pcVar5);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (bVar1) {
        pPVar6 = (PKCS12 *)
                 std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::get
                           ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_)
        ;
        local_11c = PKCS12_verify_mac(pPVar6,"foo",3);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_118,&local_11c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
        if (!bVar1) {
          testing::Message::Message(&local_128);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&key,(internal *)local_118,
                     (AssertionResult *)
                     "PKCS12_verify_mac(p12.get(), kPassword, sizeof(kPassword) - 1)","false","true"
                     ,in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_130,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x48,pcVar5);
          testing::internal::AssertHelper::operator=(&local_130,&local_128);
          testing::internal::AssertHelper::~AssertHelper(&local_130);
          std::__cxx11::string::~string((string *)&key);
          testing::Message::~Message(&local_128);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
        if (bVar1) {
          cert = (X509 *)0x0;
          ca_certs = (stack_st_X509 *)0x0;
          gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          p12_00 = std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)
                              &gtest_ar__1.message_);
          local_17c = PKCS12_parse(p12_00,"foo",(EVP_PKEY **)&cert,(X509 **)&ca_certs,
                                   (stack_st_X509 **)&gtest_ar__4.message_);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_178,&local_17c,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
          if (!bVar1) {
            testing::Message::Message(&local_188);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&delete_key,(internal *)local_178,
                       (AssertionResult *)
                       "PKCS12_parse(p12.get(), kPassword, &key, &cert, &ca_certs)","false","true",
                       in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_190,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x4d,pcVar5);
            testing::internal::AssertHelper::operator=(&local_190,&local_188);
            testing::internal::AssertHelper::~AssertHelper(&local_190);
            std::__cxx11::string::~string((string *)&delete_key);
            testing::Message::~Message(&local_188);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
          if (bVar1) {
            std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&delete_cert,(pointer)cert
                      );
            std::unique_ptr<x509_st,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<x509_st,bssl::internal::Deleter> *)&delete_ca_certs,
                       (pointer)ca_certs);
            std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::
            unique_ptr<bssl::internal::Deleter,void>
                      ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&gtest_ar__5.message_,
                       (pointer)gtest_ar__4.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
            testing::AssertionResult::AssertionResult<evp_pkey_st*>
                      ((AssertionResult *)local_1d8,(evp_pkey_st **)&cert,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
            if (!bVar1) {
              testing::Message::Message(&local_1e0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_1d8,
                         (AssertionResult *)0x8f28b1,"false","true",in_R9);
              pcVar5 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_1e8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x53,pcVar5);
              testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
              testing::internal::AssertHelper::~AssertHelper(&local_1e8);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_1e0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
            if (bVar1) {
              testing::AssertionResult::AssertionResult<x509_st*>
                        ((AssertionResult *)local_218,(x509_st **)&ca_certs,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
              if (!bVar1) {
                testing::Message::Message(&local_220);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar.message_,(internal *)local_218,
                           (AssertionResult *)0x8b1917,"false","true",in_R9);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_228,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                           ,0x54,pcVar5);
                testing::internal::AssertHelper::operator=(&local_228,&local_220);
                testing::internal::AssertHelper::~AssertHelper(&local_228);
                std::__cxx11::string::~string((string *)&gtest_ar.message_);
                testing::Message::~Message(&local_220);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
              if (bVar1) {
                local_25c = 0;
                local_268 = sk_X509_num((stack_st_X509 *)
                                        gtest_ar__4.message_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl);
                testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                          ((EqHelper *)local_258,"0u","sk_X509_num(ca_certs)",&local_25c,&local_268)
                ;
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_258);
                if (!bVar1) {
                  testing::Message::Message(&local_270);
                  pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_278,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                             ,0x55,pcVar5);
                  testing::internal::AssertHelper::operator=(&local_278,&local_270);
                  testing::internal::AssertHelper::~AssertHelper(&local_278);
                  testing::Message::~Message(&local_270);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
              }
            }
            std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__5.message_);
            std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&delete_ca_certs);
            std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&delete_cert);
          }
        }
      }
    }
    std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
  }
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

static void TestCompat(bssl::Span<const uint8_t> der) {
  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(der.data(), der.size()));
  ASSERT_TRUE(bio);

  bssl::UniquePtr<PKCS12> p12(d2i_PKCS12_bio(bio.get(), nullptr));
  ASSERT_TRUE(p12);

  ASSERT_FALSE(PKCS12_verify_mac(p12.get(), "badpass", 7));
  ASSERT_TRUE(PKCS12_verify_mac(p12.get(), kPassword, sizeof(kPassword) - 1));

  EVP_PKEY *key = nullptr;
  X509 *cert = nullptr;
  STACK_OF(X509) *ca_certs = nullptr;
  ASSERT_TRUE(PKCS12_parse(p12.get(), kPassword, &key, &cert, &ca_certs));

  bssl::UniquePtr<EVP_PKEY> delete_key(key);
  bssl::UniquePtr<X509> delete_cert(cert);
  bssl::UniquePtr<STACK_OF(X509)> delete_ca_certs(ca_certs);

  ASSERT_TRUE(key);
  ASSERT_TRUE(cert);
  ASSERT_EQ(0u, sk_X509_num(ca_certs));
}